

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O3

void presolve::dev_kkt_check::checkBasicFeasibleSolution(State *state,KktConditionDetails *details)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  
  if (0 < state->numCol) {
    lVar7 = 0;
    do {
      if ((((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar7] != 0) &&
          (details->checked = details->checked + 1,
          (state->col_status->
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar7] == kBasic)) &&
         (1e-07 < ABS((state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar7]))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Col ",4);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," is basic but has nonzero dual ",0x1f);
        poVar3 = std::ostream::_M_insert<double>
                           ((state->colDual->super__Vector_base<double,_std::allocator<double>_>).
                            _M_impl.super__Vector_impl_data._M_start[lVar7]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        dVar1 = (state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        if (dVar1 != 0.0) {
          details->violated = details->violated + 1;
          dVar9 = ABS(dVar1);
          details->sum_violation_2 = dVar1 * dVar1 + details->sum_violation_2;
          if (details->max_violation <= dVar9 && dVar9 != details->max_violation) {
            details->max_violation = dVar9;
          }
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < state->numCol);
  }
  if (0 < state->numRow) {
    lVar7 = 0;
    do {
      if ((((state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar7] != 0) &&
          (details->checked = details->checked + 1,
          (state->row_status->
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar7] == kBasic)) &&
         (1e-07 < ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar7]))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Row ",4);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," is basic but has nonzero dual: ",0x20);
        poVar3 = std::ostream::_M_insert<double>
                           (ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar7]));
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        dVar1 = (state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        if (dVar1 != 0.0) {
          details->violated = details->violated + 1;
          dVar9 = ABS(dVar1);
          details->sum_violation_2 = dVar1 * dVar1 + details->sum_violation_2;
          if (details->max_violation <= dVar9 && dVar9 != details->max_violation) {
            details->max_violation = dVar9;
          }
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < state->numRow);
  }
  if (details->violated == 0) {
    plVar4 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BFS.",4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BFS X Violated: ",0x10);
    plVar4 = (long *)std::ostream::operator<<(&std::cout,details->violated);
  }
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  iVar6 = 0;
  iVar5 = 0;
  iVar2 = 0;
  if (0 < (long)state->numRow) {
    lVar7 = 0;
    iVar2 = 0;
    iVar5 = 0;
    do {
      bVar8 = (state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar7] != 0;
      if (bVar8) {
        iVar2 = iVar2 + (uint)((state->row_status->
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               )._M_impl.super__Vector_impl_data._M_start[lVar7] == kBasic);
      }
      iVar5 = iVar5 + (uint)bVar8;
      lVar7 = lVar7 + 1;
    } while (state->numRow != lVar7);
  }
  if (0 < (long)state->numCol) {
    lVar7 = 0;
    iVar6 = 0;
    do {
      if ((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar7] != 0) {
        iVar6 = iVar6 + (uint)((state->col_status->
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               )._M_impl.super__Vector_impl_data._M_start[lVar7] == kBasic);
      }
      lVar7 = lVar7 + 1;
    } while (state->numCol != lVar7);
  }
  if (iVar6 + iVar2 == iVar5) {
    return;
  }
  details->violated = -1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BFS X Violated WRONG basis count: ",0x22);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar6 + iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  plVar4 = (long *)std::ostream::operator<<(poVar3,iVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return;
}

Assistant:

void checkBasicFeasibleSolution(const State& state,
                                KktConditionDetails& details) {
  // Go over cols and check that the duals of basic values are zero.
  assert((int)state.col_status.size() == state.numCol);
  assert((int)state.colDual.size() == state.numCol);
  for (int j = 0; j < state.numCol; j++) {
    if (state.flagCol[j]) {
      details.checked++;
      double infeas = 0;
      if (state.col_status[j] == HighsBasisStatus::kBasic &&
          fabs(state.colDual[j]) > tol) {
        if (dev_print == 1)
          std::cout << "Col " << j << " is basic but has nonzero dual "
                    << state.colDual[j] << "." << std::endl;
        infeas = fabs(state.colDual[j]);
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  // Go over rows and check that the duals of basic values are zero.
  assert((int)state.row_status.size() == state.numRow);
  assert((int)state.rowDual.size() == state.numRow);
  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) {
      details.checked++;
      double infeas = 0;
      if (state.row_status[i] == HighsBasisStatus::kBasic &&
          fabs(state.rowDual[i]) > tol) {
        if (dev_print == 1)
          std::cout << "Row " << i << " is basic but has nonzero dual: "
                    << fabs(state.rowDual[i]) << std::endl;
        infeas = fabs(state.rowDual[i]);
      }
      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "BFS." << std::endl;
  } else {
    if (dev_print == 1)
      std::cout << "BFS X Violated: " << details.violated << std::endl;
  }

  // check number of basic rows during postsolve.
  int current_n_rows = 0;
  int current_n_rows_basic = 0;
  int current_n_cols_basic = 0;

  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) current_n_rows++;

    if (state.flagRow[i] && state.row_status[i] == HighsBasisStatus::kBasic)
      current_n_rows_basic++;
  }

  for (int i = 0; i < state.numCol; i++) {
    if (state.flagCol[i] && state.col_status[i] == HighsBasisStatus::kBasic)
      current_n_cols_basic++;
  }

  bool holds = current_n_cols_basic + current_n_rows_basic == current_n_rows;
  if (!holds) {
    details.violated = -1;
    std::cout << "BFS X Violated WRONG basis count: "
              << current_n_cols_basic + current_n_rows_basic << " "
              << current_n_rows << std::endl;
  }
  //  assert(current_n_cols_basic + current_n_rows_basic == current_n_rows);
}